

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall VulkanHppGenerator::checkCorrectness(VulkanHppGenerator *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  VulkanHppGenerator *local_10;
  VulkanHppGenerator *this_local;
  
  local_10 = this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->m_vulkanLicenseHeader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"missing license header",&local_31);
  checkForError(!bVar1,-1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  checkBitmaskCorrectness(this);
  checkCommandCorrectness(this);
  checkDefineCorrectness(this);
  checkEnumCorrectness(this);
  checkExtensionCorrectness(this);
  checkFuncPointerCorrectness(this);
  checkHandleCorrectness(this);
  checkRequireCorrectness(this);
  checkSpirVCapabilityCorrectness(this);
  checkStructCorrectness(this);
  checkSyncAccessCorrectness(this);
  checkSyncStageCorrectness(this);
  return;
}

Assistant:

void VulkanHppGenerator::checkCorrectness() const
{
  checkForError( !m_vulkanLicenseHeader.empty(), -1, "missing license header" );
  checkBitmaskCorrectness();
  checkCommandCorrectness();
  checkDefineCorrectness();
  checkEnumCorrectness();
  checkExtensionCorrectness();
  checkFuncPointerCorrectness();
  checkHandleCorrectness();
  checkRequireCorrectness();
  checkSpirVCapabilityCorrectness();
  checkStructCorrectness();
  checkSyncAccessCorrectness();
  checkSyncStageCorrectness();
}